

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

uint32_t __thiscall
level_mesh::instantiate_mu_model(level_mesh *this,uint16_t model_id,uint16_t sector,fmatrix *xform)

{
  uint32_t uVar1;
  b_mu_instance local_64;
  fmatrix *local_20;
  fmatrix *xform_local;
  uint16_t sector_local;
  level_mesh *plStack_10;
  uint16_t model_id_local;
  level_mesh *this_local;
  
  local_20 = xform;
  xform_local._4_2_ = sector;
  xform_local._6_2_ = model_id;
  plStack_10 = this;
  b_mu_instance::b_mu_instance(&local_64,model_id,sector,xform);
  std::vector<b_mu_instance,_std::allocator<b_mu_instance>_>::push_back
            (&this->m_mu_instances,&local_64);
  uVar1 = this->m_free_tag;
  this->m_free_tag = uVar1 + 1;
  return uVar1;
}

Assistant:

uint32_t level_mesh::instantiate_mu_model(uint16_t model_id, uint16_t sector, const fmatrix& xform)
{
	m_mu_instances.push_back(b_mu_instance(model_id, sector, xform));
	return m_free_tag++;
}